

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O0

void __thiscall
pg::ZLKPPSolver::remove_nodes(ZLKPPSolver *this,vector<int,_std::allocator<int>_> *nodes)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  size_type sVar4;
  const_iterator cStack_30;
  int v;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *nodes_local;
  ZLKPPSolver *this_local;
  
  __end1 = std::vector<int,_std::allocator<int>_>::begin(nodes);
  cStack_30 = std::vector<int,_std::allocator<int>_>::end(nodes);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    iVar1 = *piVar3;
    this->cur_nodes_bm[iVar1] = false;
    this->cur_nodes_next[this->cur_nodes_prev[iVar1]] = this->cur_nodes_next[iVar1];
    this->cur_nodes_prev[this->cur_nodes_next[iVar1]] = this->cur_nodes_prev[iVar1];
    if (iVar1 == this->cur_first_node) {
      this->cur_first_node = this->cur_nodes_next[iVar1];
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(nodes);
  this->cur_num_nodes = this->cur_num_nodes - (int)sVar4;
  return;
}

Assistant:

void ZLKPPSolver::remove_nodes(const std::vector<int> nodes) { // "nodes" need not to be sorted
    for (int v : nodes) {
        cur_nodes_bm[v] = false;
        cur_nodes_next[cur_nodes_prev[v]] = cur_nodes_next[v];
        cur_nodes_prev[cur_nodes_next[v]] = cur_nodes_prev[v];
        if (v == cur_first_node)
            cur_first_node = cur_nodes_next[v];
    }
    cur_num_nodes -= nodes.size();
}